

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::MutableRawSplitImpl
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  FieldDescriptor *field_00;
  bool bVar1;
  uint32_t offset;
  LogMessage *pLVar2;
  void **ppvVar3;
  Arena *arena;
  string_view v;
  void **split;
  uint32_t field_offset;
  LogMessage local_40;
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  if (!bVar1) {
    offset = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,local_28);
    PrepareSplitMessageForWrite(this,(Message *)field_local);
    ppvVar3 = MutableSplitField(this,(Message *)field_local);
    bVar1 = internal::SplitFieldHasExtraIndirection(local_28);
    field_00 = local_28;
    if (bVar1) {
      ppvVar3 = internal::GetPointerAtOffset<void*>(*ppvVar3,offset);
      arena = MessageLite::GetArena((MessageLite *)field_local);
      this_local = (Reflection *)AllocIfDefault<void>(field_00,ppvVar3,arena);
    }
    else {
      this_local = (Reflection *)internal::GetPointerAtOffset<void>(*ppvVar3,offset);
    }
    return this_local;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xb6c,"!schema_.InRealOneof(field)");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [9])"Field = ")
  ;
  v = FieldDescriptor::full_name(local_28);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void* Reflection::MutableRawSplitImpl(Message* message,
                                      const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  PrepareSplitMessageForWrite(message);
  void** split = MutableSplitField(message);
  if (SplitFieldHasExtraIndirection(field)) {
    return AllocIfDefault(field,
                          *GetPointerAtOffset<void*>(*split, field_offset),
                          message->GetArena());
  }
  return GetPointerAtOffset<void>(*split, field_offset);
}